

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  size_t k;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  byte bVar42;
  bool bVar43;
  byte bVar44;
  int iVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  long lVar47;
  undefined1 (*pauVar48) [32];
  uint uVar49;
  ulong uVar50;
  ulong *puVar51;
  NodeRef root;
  long lVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar84;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar94 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar95 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2b8c;
  Precalculations local_2b81;
  ulong local_2b80;
  RayQueryContext *local_2b78;
  ulong local_2b70;
  undefined4 local_2b68;
  undefined4 local_2b64;
  RayK<8> *local_2b60;
  Geometry *local_2b58;
  RTCFilterFunctionNArguments local_2b50;
  undefined1 local_2b20 [32];
  BVH *local_2b00;
  Intersectors *local_2af8;
  long local_2af0;
  long local_2ae8;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2aa0;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined4 uStack_29a4;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined4 uStack_2984;
  int local_2980;
  int iStack_297c;
  int iStack_2978;
  int iStack_2974;
  int iStack_2970;
  int iStack_296c;
  int iStack_2968;
  int iStack_2964;
  uint local_2960;
  uint uStack_295c;
  uint uStack_2958;
  uint uStack_2954;
  uint uStack_2950;
  uint uStack_294c;
  uint uStack_2948;
  uint uStack_2944;
  uint local_2940;
  uint uStack_293c;
  uint uStack_2938;
  uint uStack_2934;
  uint uStack_2930;
  uint uStack_292c;
  uint uStack_2928;
  uint uStack_2924;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_28e0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_28c0;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2800;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2780;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26e0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26c0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26a0;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2660;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2640;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2b00 = (BVH *)This->ptr;
  local_2608 = (local_2b00->root).ptr;
  if (local_2608 != 8) {
    auVar56 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar87 = ZEXT816(0) << 0x40;
    uVar54 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar87),5);
    uVar46 = vpcmpeqd_avx512vl(auVar56,(undefined1  [32])valid_i->field_0);
    uVar54 = uVar54 & uVar46;
    bVar44 = (byte)uVar54;
    if (bVar44 != 0) {
      local_2aa0._0_8_ = *(undefined8 *)ray;
      local_2aa0._8_8_ = *(undefined8 *)(ray + 8);
      local_2aa0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2aa0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2aa0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2aa0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2aa0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2aa0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2aa0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2aa0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2aa0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2aa0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2a40 = *(undefined1 (*) [32])(ray + 0x80);
      local_2a20 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2a00 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar98 = ZEXT3264(auVar56);
      vandps_avx512vl(local_2a40,auVar56);
      auVar60._8_4_ = 0x219392ef;
      auVar60._0_8_ = 0x219392ef219392ef;
      auVar60._12_4_ = 0x219392ef;
      auVar60._16_4_ = 0x219392ef;
      auVar60._20_4_ = 0x219392ef;
      auVar60._24_4_ = 0x219392ef;
      auVar60._28_4_ = 0x219392ef;
      uVar46 = vcmpps_avx512vl(auVar56,auVar60,1);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar99 = ZEXT3264(auVar57);
      auVar58 = vdivps_avx512vl(auVar57,local_2a40);
      vandps_avx512vl(local_2a20,auVar56);
      uVar19 = vcmpps_avx512vl(auVar58,auVar60,1);
      auVar59 = vdivps_avx512vl(auVar57,local_2a20);
      vandps_avx512vl(local_2a00,auVar56);
      uVar55 = vcmpps_avx512vl(auVar59,auVar60,1);
      auVar56 = vdivps_avx512vl(auVar57,local_2a00);
      bVar43 = (bool)((byte)uVar46 & 1);
      local_29e0._0_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._0_4_;
      bVar43 = (bool)((byte)(uVar46 >> 1) & 1);
      local_29e0._4_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._4_4_;
      bVar43 = (bool)((byte)(uVar46 >> 2) & 1);
      local_29e0._8_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._8_4_;
      bVar43 = (bool)((byte)(uVar46 >> 3) & 1);
      local_29e0._12_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._12_4_;
      bVar43 = (bool)((byte)(uVar46 >> 4) & 1);
      local_29e0._16_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._16_4_;
      bVar43 = (bool)((byte)(uVar46 >> 5) & 1);
      local_29e0._20_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._20_4_;
      bVar43 = (bool)((byte)(uVar46 >> 6) & 1);
      local_29e0._24_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._24_4_;
      bVar43 = SUB81(uVar46 >> 7,0);
      local_29e0._28_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar58._28_4_;
      bVar43 = (bool)((byte)uVar19 & 1);
      local_29c0._0_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._0_4_;
      bVar43 = (bool)((byte)(uVar19 >> 1) & 1);
      local_29c0._4_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._4_4_;
      bVar43 = (bool)((byte)(uVar19 >> 2) & 1);
      fStack_29b8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._8_4_);
      bVar43 = (bool)((byte)(uVar19 >> 3) & 1);
      fStack_29b4 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._12_4_);
      bVar43 = (bool)((byte)(uVar19 >> 4) & 1);
      fStack_29b0 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._16_4_);
      bVar43 = (bool)((byte)(uVar19 >> 5) & 1);
      fStack_29ac = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._20_4_);
      bVar43 = (bool)((byte)(uVar19 >> 6) & 1);
      fStack_29a8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._24_4_);
      bVar43 = SUB81(uVar19 >> 7,0);
      uStack_29a4 = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar59._28_4_;
      bVar43 = (bool)((byte)uVar55 & 1);
      local_29a0._0_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._0_4_;
      bVar43 = (bool)((byte)(uVar55 >> 1) & 1);
      local_29a0._4_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._4_4_;
      bVar43 = (bool)((byte)(uVar55 >> 2) & 1);
      fStack_2998 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._8_4_);
      bVar43 = (bool)((byte)(uVar55 >> 3) & 1);
      fStack_2994 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._12_4_);
      bVar43 = (bool)((byte)(uVar55 >> 4) & 1);
      fStack_2990 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._16_4_);
      bVar43 = (bool)((byte)(uVar55 >> 5) & 1);
      fStack_298c = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._20_4_);
      bVar43 = (bool)((byte)(uVar55 >> 6) & 1);
      fStack_2988 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._24_4_);
      bVar43 = SUB81(uVar55 >> 7,0);
      uStack_2984 = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar56._28_4_;
      uVar46 = vcmpps_avx512vl(local_29e0,ZEXT1632(auVar87),1);
      auVar56 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2980 = (uint)((byte)uVar46 & 1) * auVar56._0_4_;
      iStack_297c = (uint)((byte)(uVar46 >> 1) & 1) * auVar56._4_4_;
      iStack_2978 = (uint)((byte)(uVar46 >> 2) & 1) * auVar56._8_4_;
      iStack_2974 = (uint)((byte)(uVar46 >> 3) & 1) * auVar56._12_4_;
      iStack_2970 = (uint)((byte)(uVar46 >> 4) & 1) * auVar56._16_4_;
      iStack_296c = (uint)((byte)(uVar46 >> 5) & 1) * auVar56._20_4_;
      iStack_2968 = (uint)((byte)(uVar46 >> 6) & 1) * auVar56._24_4_;
      iStack_2964 = (uint)(byte)(uVar46 >> 7) * auVar56._28_4_;
      auVar57 = ZEXT1632(auVar87);
      uVar46 = vcmpps_avx512vl(_local_29c0,auVar57,5);
      auVar56 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar43 = (bool)((byte)uVar46 & 1);
      local_2960 = (uint)bVar43 * auVar56._0_4_ | (uint)!bVar43 * 0x30;
      bVar43 = (bool)((byte)(uVar46 >> 1) & 1);
      uStack_295c = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * 0x30;
      bVar43 = (bool)((byte)(uVar46 >> 2) & 1);
      uStack_2958 = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * 0x30;
      bVar43 = (bool)((byte)(uVar46 >> 3) & 1);
      uStack_2954 = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * 0x30;
      bVar43 = (bool)((byte)(uVar46 >> 4) & 1);
      uStack_2950 = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * 0x30;
      bVar43 = (bool)((byte)(uVar46 >> 5) & 1);
      uStack_294c = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * 0x30;
      bVar43 = (bool)((byte)(uVar46 >> 6) & 1);
      uStack_2948 = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * 0x30;
      bVar43 = SUB81(uVar46 >> 7,0);
      uStack_2944 = (uint)bVar43 * auVar56._28_4_ | (uint)!bVar43 * 0x30;
      uVar46 = vcmpps_avx512vl(_local_29a0,auVar57,5);
      auVar56 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar43 = (bool)((byte)uVar46 & 1);
      local_2940 = (uint)bVar43 * auVar56._0_4_ | (uint)!bVar43 * 0x50;
      bVar43 = (bool)((byte)(uVar46 >> 1) & 1);
      uStack_293c = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * 0x50;
      bVar43 = (bool)((byte)(uVar46 >> 2) & 1);
      uStack_2938 = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * 0x50;
      bVar43 = (bool)((byte)(uVar46 >> 3) & 1);
      uStack_2934 = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * 0x50;
      bVar43 = (bool)((byte)(uVar46 >> 4) & 1);
      uStack_2930 = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * 0x50;
      bVar43 = (bool)((byte)(uVar46 >> 5) & 1);
      uStack_292c = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * 0x50;
      bVar43 = (bool)((byte)(uVar46 >> 6) & 1);
      uStack_2928 = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * 0x50;
      bVar43 = SUB81(uVar46 >> 7,0);
      uStack_2924 = (uint)bVar43 * auVar56._28_4_ | (uint)!bVar43 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = ZEXT3264(local_1e80);
      local_2b68 = (undefined4)uVar54;
      auVar56 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar57);
      local_2920._0_4_ =
           (uint)(bVar44 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar44 & 1) * local_1e80._0_4_;
      bVar43 = (bool)((byte)(uVar54 >> 1) & 1);
      local_2920._4_4_ = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * local_1e80._4_4_;
      bVar43 = (bool)((byte)(uVar54 >> 2) & 1);
      local_2920._8_4_ = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * local_1e80._8_4_;
      bVar43 = (bool)((byte)(uVar54 >> 3) & 1);
      local_2920._12_4_ = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * local_1e80._12_4_;
      bVar43 = (bool)((byte)(uVar54 >> 4) & 1);
      local_2920._16_4_ = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * local_1e80._16_4_;
      bVar43 = (bool)((byte)(uVar54 >> 5) & 1);
      local_2920._20_4_ = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * local_1e80._20_4_;
      bVar43 = (bool)((byte)(uVar54 >> 6) & 1);
      local_2920._24_4_ = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * local_1e80._24_4_;
      bVar43 = SUB81(uVar54 >> 7,0);
      local_2920._28_4_ = (uint)bVar43 * auVar56._28_4_ | (uint)!bVar43 * local_1e80._28_4_;
      auVar56 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar57);
      local_2900._0_4_ = (uint)(bVar44 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar44 & 1) * -0x800000;
      bVar43 = (bool)((byte)(uVar54 >> 1) & 1);
      local_2900._4_4_ = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * -0x800000;
      bVar43 = (bool)((byte)(uVar54 >> 2) & 1);
      local_2900._8_4_ = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * -0x800000;
      bVar43 = (bool)((byte)(uVar54 >> 3) & 1);
      local_2900._12_4_ = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * -0x800000;
      bVar43 = (bool)((byte)(uVar54 >> 4) & 1);
      local_2900._16_4_ = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * -0x800000;
      bVar43 = (bool)((byte)(uVar54 >> 5) & 1);
      local_2900._20_4_ = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * -0x800000;
      bVar43 = (bool)((byte)(uVar54 >> 6) & 1);
      local_2900._24_4_ = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * -0x800000;
      bVar43 = SUB81(uVar54 >> 7,0);
      local_2900._28_4_ = (uint)bVar43 * auVar56._28_4_ | (uint)!bVar43 * -0x800000;
      local_2b8c = (uint)(byte)~bVar44;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar54 = 5;
      }
      else {
        uVar54 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2b60 = ray + 0x100;
      puVar51 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar48 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2920;
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar101 = ZEXT3264(auVar56);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar102 = ZEXT3264(auVar56);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar103 = ZEXT3264(auVar56);
      local_2b80 = uVar54;
      local_2b78 = context;
      local_2af8 = This;
LAB_01d00677:
      do {
        do {
          root.ptr = puVar51[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0133c;
          puVar51 = puVar51 + -1;
          pauVar48 = pauVar48 + -1;
          auVar56 = *pauVar48;
          auVar97 = ZEXT3264(auVar56);
          uVar46 = vcmpps_avx512vl(auVar56,local_2900,1);
        } while ((char)uVar46 == '\0');
        uVar19 = (ulong)(uint)POPCOUNT((int)uVar46);
        if (uVar54 < (uint)POPCOUNT((int)uVar46)) {
LAB_01d006b9:
          do {
            lVar47 = -0x10;
            uVar49 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0133c;
              uVar21 = vcmpps_avx512vl(auVar97._0_32_,local_2900,9);
              if ((char)uVar21 == '\0') goto LAB_01d00677;
              local_2af0 = (ulong)(uVar49 & 0xf) - 8;
              bVar44 = ~(byte)local_2b8c;
              lVar52 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              lVar47 = 0;
              goto LAB_01d0092b;
            }
            uVar46 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar56 = auVar100._0_32_;
            for (; (lVar47 != 0 && (uVar19 = *(ulong *)(uVar46 + 0x20 + lVar47 * 2), uVar19 != 8));
                lVar47 = lVar47 + 4) {
              uVar1 = *(undefined4 *)(uVar46 + 0x90 + lVar47);
              auVar88._4_4_ = uVar1;
              auVar88._0_4_ = uVar1;
              auVar88._8_4_ = uVar1;
              auVar88._12_4_ = uVar1;
              auVar88._16_4_ = uVar1;
              auVar88._20_4_ = uVar1;
              auVar88._24_4_ = uVar1;
              auVar88._28_4_ = uVar1;
              auVar57 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar1 = *(undefined4 *)(uVar46 + 0x30 + lVar47);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25._16_4_ = uVar1;
              auVar25._20_4_ = uVar1;
              auVar25._24_4_ = uVar1;
              auVar25._28_4_ = uVar1;
              auVar58 = vfmadd213ps_avx512vl(auVar88,auVar57,auVar25);
              uVar1 = *(undefined4 *)(uVar46 + 0xb0 + lVar47);
              auVar89._4_4_ = uVar1;
              auVar89._0_4_ = uVar1;
              auVar89._8_4_ = uVar1;
              auVar89._12_4_ = uVar1;
              auVar89._16_4_ = uVar1;
              auVar89._20_4_ = uVar1;
              auVar89._24_4_ = uVar1;
              auVar89._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar46 + 0x50 + lVar47);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar59 = vfmadd213ps_avx512vl(auVar89,auVar57,auVar26);
              uVar1 = *(undefined4 *)(uVar46 + 0xd0 + lVar47);
              auVar90._4_4_ = uVar1;
              auVar90._0_4_ = uVar1;
              auVar90._8_4_ = uVar1;
              auVar90._12_4_ = uVar1;
              auVar90._16_4_ = uVar1;
              auVar90._20_4_ = uVar1;
              auVar90._24_4_ = uVar1;
              auVar90._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar46 + 0x70 + lVar47);
              auVar27._4_4_ = uVar1;
              auVar27._0_4_ = uVar1;
              auVar27._8_4_ = uVar1;
              auVar27._12_4_ = uVar1;
              auVar27._16_4_ = uVar1;
              auVar27._20_4_ = uVar1;
              auVar27._24_4_ = uVar1;
              auVar27._28_4_ = uVar1;
              auVar60 = vfmadd213ps_avx512vl(auVar90,auVar57,auVar27);
              uVar1 = *(undefined4 *)(uVar46 + 0xa0 + lVar47);
              auVar91._4_4_ = uVar1;
              auVar91._0_4_ = uVar1;
              auVar91._8_4_ = uVar1;
              auVar91._12_4_ = uVar1;
              auVar91._16_4_ = uVar1;
              auVar91._20_4_ = uVar1;
              auVar91._24_4_ = uVar1;
              auVar91._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar46 + 0x40 + lVar47);
              auVar28._4_4_ = uVar1;
              auVar28._0_4_ = uVar1;
              auVar28._8_4_ = uVar1;
              auVar28._12_4_ = uVar1;
              auVar28._16_4_ = uVar1;
              auVar28._20_4_ = uVar1;
              auVar28._24_4_ = uVar1;
              auVar28._28_4_ = uVar1;
              auVar61 = vfmadd213ps_avx512vl(auVar91,auVar57,auVar28);
              uVar1 = *(undefined4 *)(uVar46 + 0xc0 + lVar47);
              auVar92._4_4_ = uVar1;
              auVar92._0_4_ = uVar1;
              auVar92._8_4_ = uVar1;
              auVar92._12_4_ = uVar1;
              auVar92._16_4_ = uVar1;
              auVar92._20_4_ = uVar1;
              auVar92._24_4_ = uVar1;
              auVar92._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar46 + 0x60 + lVar47);
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar29._16_4_ = uVar1;
              auVar29._20_4_ = uVar1;
              auVar29._24_4_ = uVar1;
              auVar29._28_4_ = uVar1;
              auVar62 = vfmadd213ps_avx512vl(auVar92,auVar57,auVar29);
              uVar1 = *(undefined4 *)(uVar46 + 0xe0 + lVar47);
              auVar93._4_4_ = uVar1;
              auVar93._0_4_ = uVar1;
              auVar93._8_4_ = uVar1;
              auVar93._12_4_ = uVar1;
              auVar93._16_4_ = uVar1;
              auVar93._20_4_ = uVar1;
              auVar93._24_4_ = uVar1;
              auVar93._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar46 + 0x80 + lVar47);
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              auVar30._16_4_ = uVar1;
              auVar30._20_4_ = uVar1;
              auVar30._24_4_ = uVar1;
              auVar30._28_4_ = uVar1;
              auVar63 = vfmadd213ps_avx512vl(auVar93,auVar57,auVar30);
              auVar39._8_8_ = local_2aa0._8_8_;
              auVar39._0_8_ = local_2aa0._0_8_;
              auVar39._16_8_ = local_2aa0._16_8_;
              auVar39._24_8_ = local_2aa0._24_8_;
              auVar40._8_8_ = local_2aa0._40_8_;
              auVar40._0_8_ = local_2aa0._32_8_;
              auVar40._16_8_ = local_2aa0._48_8_;
              auVar40._24_8_ = local_2aa0._56_8_;
              auVar41._8_8_ = local_2aa0._72_8_;
              auVar41._0_8_ = local_2aa0._64_8_;
              auVar41._16_8_ = local_2aa0._80_8_;
              auVar41._24_8_ = local_2aa0._88_8_;
              auVar58 = vsubps_avx(auVar58,auVar39);
              auVar94._0_4_ = local_29e0._0_4_ * auVar58._0_4_;
              auVar94._4_4_ = local_29e0._4_4_ * auVar58._4_4_;
              auVar94._8_4_ = local_29e0._8_4_ * auVar58._8_4_;
              auVar94._12_4_ = local_29e0._12_4_ * auVar58._12_4_;
              auVar94._16_4_ = local_29e0._16_4_ * auVar58._16_4_;
              auVar94._20_4_ = local_29e0._20_4_ * auVar58._20_4_;
              auVar94._28_36_ = in_ZMM13._28_36_;
              auVar94._24_4_ = local_29e0._24_4_ * auVar58._24_4_;
              auVar71 = auVar94._0_32_;
              in_ZMM13 = ZEXT3264(auVar71);
              auVar58 = vsubps_avx(auVar59,auVar40);
              auVar95._0_4_ = auVar58._0_4_ * (float)local_29c0._0_4_;
              auVar95._4_4_ = auVar58._4_4_ * (float)local_29c0._4_4_;
              auVar95._8_4_ = auVar58._8_4_ * fStack_29b8;
              auVar95._12_4_ = auVar58._12_4_ * fStack_29b4;
              auVar95._16_4_ = auVar58._16_4_ * fStack_29b0;
              auVar95._20_4_ = auVar58._20_4_ * fStack_29ac;
              auVar95._28_36_ = in_ZMM14._28_36_;
              auVar95._24_4_ = auVar58._24_4_ * fStack_29a8;
              auVar72 = auVar95._0_32_;
              in_ZMM14 = ZEXT3264(auVar72);
              auVar58 = vsubps_avx(auVar60,auVar41);
              auVar96._0_4_ = auVar58._0_4_ * (float)local_29a0._0_4_;
              auVar96._4_4_ = auVar58._4_4_ * (float)local_29a0._4_4_;
              auVar96._8_4_ = auVar58._8_4_ * fStack_2998;
              auVar96._12_4_ = auVar58._12_4_ * fStack_2994;
              auVar96._16_4_ = auVar58._16_4_ * fStack_2990;
              auVar96._20_4_ = auVar58._20_4_ * fStack_298c;
              auVar96._28_36_ = in_ZMM15._28_36_;
              auVar96._24_4_ = auVar58._24_4_ * fStack_2988;
              auVar73 = auVar96._0_32_;
              in_ZMM15 = ZEXT3264(auVar73);
              auVar58 = vsubps_avx(auVar61,auVar39);
              auVar34._4_4_ = local_29e0._4_4_ * auVar58._4_4_;
              auVar34._0_4_ = local_29e0._0_4_ * auVar58._0_4_;
              auVar34._8_4_ = local_29e0._8_4_ * auVar58._8_4_;
              auVar34._12_4_ = local_29e0._12_4_ * auVar58._12_4_;
              auVar34._16_4_ = local_29e0._16_4_ * auVar58._16_4_;
              auVar34._20_4_ = local_29e0._20_4_ * auVar58._20_4_;
              auVar34._24_4_ = local_29e0._24_4_ * auVar58._24_4_;
              auVar34._28_4_ = auVar61._28_4_;
              auVar58 = vsubps_avx(auVar62,auVar40);
              auVar35._4_4_ = auVar58._4_4_ * (float)local_29c0._4_4_;
              auVar35._0_4_ = auVar58._0_4_ * (float)local_29c0._0_4_;
              auVar35._8_4_ = auVar58._8_4_ * fStack_29b8;
              auVar35._12_4_ = auVar58._12_4_ * fStack_29b4;
              auVar35._16_4_ = auVar58._16_4_ * fStack_29b0;
              auVar35._20_4_ = auVar58._20_4_ * fStack_29ac;
              auVar35._24_4_ = auVar58._24_4_ * fStack_29a8;
              auVar35._28_4_ = uStack_29a4;
              auVar58 = vsubps_avx(auVar63,auVar41);
              auVar36._4_4_ = auVar58._4_4_ * (float)local_29a0._4_4_;
              auVar36._0_4_ = auVar58._0_4_ * (float)local_29a0._0_4_;
              auVar36._8_4_ = auVar58._8_4_ * fStack_2998;
              auVar36._12_4_ = auVar58._12_4_ * fStack_2994;
              auVar36._16_4_ = auVar58._16_4_ * fStack_2990;
              auVar36._20_4_ = auVar58._20_4_ * fStack_298c;
              auVar36._24_4_ = auVar58._24_4_ * fStack_2988;
              auVar36._28_4_ = uStack_2984;
              auVar58 = vpminsd_avx2(auVar71,auVar34);
              auVar59 = vpminsd_avx2(auVar72,auVar35);
              auVar58 = vpmaxsd_avx2(auVar58,auVar59);
              auVar59 = vpminsd_avx2(auVar73,auVar36);
              auVar58 = vpmaxsd_avx2(auVar58,auVar59);
              auVar60 = vmulps_avx512vl(auVar58,auVar101._0_32_);
              auVar58 = vpmaxsd_avx2(auVar71,auVar34);
              auVar59 = vpmaxsd_avx2(auVar72,auVar35);
              auVar59 = vpminsd_avx2(auVar58,auVar59);
              auVar58 = vpmaxsd_avx2(auVar73,auVar36);
              auVar58 = vpminsd_avx2(auVar59,auVar58);
              auVar59 = vmulps_avx512vl(auVar58,auVar102._0_32_);
              auVar58 = vpmaxsd_avx2(auVar60,local_2920);
              auVar59 = vpminsd_avx2(auVar59,local_2900);
              uVar55 = vcmpps_avx512vl(auVar58,auVar59,2);
              if ((uVar49 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar46 + 0xf0 + lVar47);
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                auVar31._16_4_ = uVar1;
                auVar31._20_4_ = uVar1;
                auVar31._24_4_ = uVar1;
                auVar31._28_4_ = uVar1;
                uVar50 = vcmpps_avx512vl(auVar57,auVar31,0xd);
                uVar1 = *(undefined4 *)(uVar46 + 0x100 + lVar47);
                auVar32._4_4_ = uVar1;
                auVar32._0_4_ = uVar1;
                auVar32._8_4_ = uVar1;
                auVar32._12_4_ = uVar1;
                auVar32._16_4_ = uVar1;
                auVar32._20_4_ = uVar1;
                auVar32._24_4_ = uVar1;
                auVar32._28_4_ = uVar1;
                uVar20 = vcmpps_avx512vl(auVar57,auVar32,1);
                uVar55 = uVar55 & uVar50 & uVar20;
              }
              uVar50 = vcmpps_avx512vl(local_2900,auVar97._0_32_,6);
              uVar55 = uVar55 & uVar50;
              uVar50 = root.ptr;
              auVar64 = auVar56;
              if ((byte)uVar55 != 0) {
                auVar58 = vblendmps_avx512vl(auVar100._0_32_,auVar60);
                bVar43 = (bool)((byte)uVar55 & 1);
                auVar64._0_4_ = (uint)bVar43 * auVar58._0_4_ | (uint)!bVar43 * auVar57._0_4_;
                bVar43 = (bool)((byte)(uVar55 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar43 * auVar58._4_4_ | (uint)!bVar43 * auVar57._4_4_;
                bVar43 = (bool)((byte)(uVar55 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar43 * auVar58._8_4_ | (uint)!bVar43 * auVar57._8_4_;
                bVar43 = (bool)((byte)(uVar55 >> 3) & 1);
                auVar64._12_4_ = (uint)bVar43 * auVar58._12_4_ | (uint)!bVar43 * auVar57._12_4_;
                bVar43 = (bool)((byte)(uVar55 >> 4) & 1);
                auVar64._16_4_ = (uint)bVar43 * auVar58._16_4_ | (uint)!bVar43 * auVar57._16_4_;
                bVar43 = (bool)((byte)(uVar55 >> 5) & 1);
                auVar64._20_4_ = (uint)bVar43 * auVar58._20_4_ | (uint)!bVar43 * auVar57._20_4_;
                bVar43 = (bool)((byte)(uVar55 >> 6) & 1);
                auVar64._24_4_ = (uint)bVar43 * auVar58._24_4_ | (uint)!bVar43 * auVar57._24_4_;
                bVar43 = SUB81(uVar55 >> 7,0);
                auVar64._28_4_ = (uint)bVar43 * auVar58._28_4_ | (uint)!bVar43 * auVar57._28_4_;
                uVar50 = uVar19;
                if (root.ptr != 8) {
                  *puVar51 = root.ptr;
                  puVar51 = puVar51 + 1;
                  *pauVar48 = auVar56;
                  pauVar48 = pauVar48 + 1;
                }
              }
              auVar56 = auVar64;
              root.ptr = uVar50;
            }
            if (root.ptr == 8) goto LAB_01d008c9;
            uVar21 = vcmpps_avx512vl(auVar56,local_2900,9);
            auVar97 = ZEXT3264(auVar56);
          } while ((byte)uVar54 < (byte)POPCOUNT((int)uVar21));
          *puVar51 = root.ptr;
          puVar51 = puVar51 + 1;
          *pauVar48 = auVar56;
          pauVar48 = pauVar48 + 1;
LAB_01d008c9:
          iVar45 = 4;
        }
        else {
          while (local_2ae0 = auVar56, local_2b70 = uVar19, bVar44 = (byte)local_2b8c, uVar46 != 0)
          {
            k = 0;
            for (uVar54 = uVar46; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_2b20._0_8_ = k;
            uVar46 = uVar46 - 1 & uVar46;
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar43 = occluded1(local_2af8,local_2b00,root,k,&local_2b81,ray,
                               (TravRayK<8,_true> *)&local_2aa0.field_0,context);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar103 = ZEXT3264(auVar56);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar100 = ZEXT3264(auVar56);
            bVar42 = (byte)(1 << (local_2b20._0_4_ & 0x1f));
            if (!bVar43) {
              bVar42 = 0;
            }
            local_2b8c = (uint)(bVar44 | bVar42);
            uVar54 = local_2b80;
            context = local_2b78;
            uVar19 = local_2b70;
            auVar56 = local_2ae0;
          }
          iVar45 = 3;
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar101 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar102 = ZEXT3264(auVar56);
          auVar97 = ZEXT3264(local_2ae0);
          if (bVar44 != 0xff) {
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_2900._0_4_ =
                 (uint)(bVar44 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar44 & 1) * local_2900._0_4_;
            bVar43 = (bool)((byte)(local_2b8c >> 1) & 1);
            local_2900._4_4_ = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * local_2900._4_4_;
            bVar43 = (bool)((byte)(local_2b8c >> 2) & 1);
            local_2900._8_4_ = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * local_2900._8_4_;
            bVar43 = (bool)((byte)(local_2b8c >> 3) & 1);
            local_2900._12_4_ = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * local_2900._12_4_;
            bVar43 = (bool)((byte)(local_2b8c >> 4) & 1);
            local_2900._16_4_ = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * local_2900._16_4_;
            bVar43 = (bool)((byte)(local_2b8c >> 5) & 1);
            local_2900._20_4_ = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * local_2900._20_4_;
            bVar43 = (bool)((byte)(local_2b8c >> 6) & 1);
            local_2900._24_4_ = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * local_2900._24_4_;
            local_2900._28_4_ =
                 (local_2b8c >> 7) * auVar56._28_4_ |
                 (uint)!SUB41(local_2b8c >> 7,0) * local_2900._28_4_;
            iVar45 = 2;
          }
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar98 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar99 = ZEXT3264(auVar56);
          if ((uint)uVar54 < (uint)local_2b70) goto LAB_01d006b9;
        }
      } while ((iVar45 == 4) || (iVar45 == 2));
LAB_01d0133c:
      bVar44 = (byte)local_2b8c;
LAB_01d01344:
      bVar44 = bVar44 & (byte)local_2b68;
      bVar43 = (bool)(bVar44 >> 1 & 1);
      bVar5 = (bool)(bVar44 >> 2 & 1);
      bVar6 = (bool)(bVar44 >> 3 & 1);
      bVar7 = (bool)(bVar44 >> 4 & 1);
      bVar8 = (bool)(bVar44 >> 5 & 1);
      bVar10 = (bool)(bVar44 >> 6 & 1);
      *(uint *)local_2b60 =
           (uint)(bVar44 & 1) * -0x800000 | (uint)!(bool)(bVar44 & 1) * *(int *)local_2b60;
      *(uint *)(local_2b60 + 4) =
           (uint)bVar43 * -0x800000 | (uint)!bVar43 * *(int *)(local_2b60 + 4);
      *(uint *)(local_2b60 + 8) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_2b60 + 8);
      *(uint *)(local_2b60 + 0xc) =
           (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_2b60 + 0xc);
      *(uint *)(local_2b60 + 0x10) =
           (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_2b60 + 0x10);
      *(uint *)(local_2b60 + 0x14) =
           (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_2b60 + 0x14);
      *(uint *)(local_2b60 + 0x18) =
           (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_2b60 + 0x18);
      *(uint *)(local_2b60 + 0x1c) =
           (uint)(bVar44 >> 7) * -0x800000 |
           (uint)!(bool)(bVar44 >> 7) * *(int *)(local_2b60 + 0x1c);
    }
  }
  return;
LAB_01d0092b:
  do {
    uVar49 = (uint)bVar44;
    lVar53 = -0x10;
    if (lVar47 == local_2af0) goto LAB_01d011e5;
    do {
      local_2ae8 = lVar47;
      if (lVar53 == 0) goto LAB_01d011c8;
      uVar46 = CONCAT44(0,*(uint *)(lVar52 + lVar53));
      local_2b20._0_8_ = uVar46;
      if (uVar46 == 0xffffffff) goto LAB_01d011c8;
      auVar56 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar1 = *(undefined4 *)(lVar52 + -0x90 + lVar53);
      auVar66._4_4_ = uVar1;
      auVar66._0_4_ = uVar1;
      auVar66._8_4_ = uVar1;
      auVar66._12_4_ = uVar1;
      auVar66._16_4_ = uVar1;
      auVar66._20_4_ = uVar1;
      auVar66._24_4_ = uVar1;
      auVar66._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x80 + lVar53);
      auVar67._4_4_ = uVar1;
      auVar67._0_4_ = uVar1;
      auVar67._8_4_ = uVar1;
      auVar67._12_4_ = uVar1;
      auVar67._16_4_ = uVar1;
      auVar67._20_4_ = uVar1;
      auVar67._24_4_ = uVar1;
      auVar67._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x70 + lVar53);
      auVar68._4_4_ = uVar1;
      auVar68._0_4_ = uVar1;
      auVar68._8_4_ = uVar1;
      auVar68._12_4_ = uVar1;
      auVar68._16_4_ = uVar1;
      auVar68._20_4_ = uVar1;
      auVar68._24_4_ = uVar1;
      auVar68._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x120 + lVar53);
      auVar57._4_4_ = uVar1;
      auVar57._0_4_ = uVar1;
      auVar57._8_4_ = uVar1;
      auVar57._12_4_ = uVar1;
      auVar57._16_4_ = uVar1;
      auVar57._20_4_ = uVar1;
      auVar57._24_4_ = uVar1;
      auVar57._28_4_ = uVar1;
      auVar65 = vfmadd213ps_avx512vl(auVar66,auVar56,auVar57);
      uVar1 = *(undefined4 *)(lVar52 + -0x110 + lVar53);
      auVar58._4_4_ = uVar1;
      auVar58._0_4_ = uVar1;
      auVar58._8_4_ = uVar1;
      auVar58._12_4_ = uVar1;
      auVar58._16_4_ = uVar1;
      auVar58._20_4_ = uVar1;
      auVar58._24_4_ = uVar1;
      auVar58._28_4_ = uVar1;
      auVar66 = vfmadd213ps_avx512vl(auVar67,auVar56,auVar58);
      uVar1 = *(undefined4 *)(lVar52 + -0x100 + lVar53);
      auVar59._4_4_ = uVar1;
      auVar59._0_4_ = uVar1;
      auVar59._8_4_ = uVar1;
      auVar59._12_4_ = uVar1;
      auVar59._16_4_ = uVar1;
      auVar59._20_4_ = uVar1;
      auVar59._24_4_ = uVar1;
      auVar59._28_4_ = uVar1;
      auVar67 = vfmadd213ps_avx512vl(auVar68,auVar56,auVar59);
      uVar1 = *(undefined4 *)(lVar52 + -0x60 + lVar53);
      auVar69._4_4_ = uVar1;
      auVar69._0_4_ = uVar1;
      auVar69._8_4_ = uVar1;
      auVar69._12_4_ = uVar1;
      auVar69._16_4_ = uVar1;
      auVar69._20_4_ = uVar1;
      auVar69._24_4_ = uVar1;
      auVar69._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x50 + lVar53);
      auVar70._4_4_ = uVar1;
      auVar70._0_4_ = uVar1;
      auVar70._8_4_ = uVar1;
      auVar70._12_4_ = uVar1;
      auVar70._16_4_ = uVar1;
      auVar70._20_4_ = uVar1;
      auVar70._24_4_ = uVar1;
      auVar70._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x40 + lVar53);
      auVar74._4_4_ = uVar1;
      auVar74._0_4_ = uVar1;
      auVar74._8_4_ = uVar1;
      auVar74._12_4_ = uVar1;
      auVar74._16_4_ = uVar1;
      auVar74._20_4_ = uVar1;
      auVar74._24_4_ = uVar1;
      auVar74._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0xf0 + lVar53);
      auVar61._4_4_ = uVar1;
      auVar61._0_4_ = uVar1;
      auVar61._8_4_ = uVar1;
      auVar61._12_4_ = uVar1;
      auVar61._16_4_ = uVar1;
      auVar61._20_4_ = uVar1;
      auVar61._24_4_ = uVar1;
      auVar61._28_4_ = uVar1;
      auVar68 = vfmadd213ps_avx512vl(auVar69,auVar56,auVar61);
      uVar1 = *(undefined4 *)(lVar52 + -0xe0 + lVar53);
      auVar62._4_4_ = uVar1;
      auVar62._0_4_ = uVar1;
      auVar62._8_4_ = uVar1;
      auVar62._12_4_ = uVar1;
      auVar62._16_4_ = uVar1;
      auVar62._20_4_ = uVar1;
      auVar62._24_4_ = uVar1;
      auVar62._28_4_ = uVar1;
      auVar69 = vfmadd213ps_avx512vl(auVar70,auVar56,auVar62);
      uVar1 = *(undefined4 *)(lVar52 + -0xd0 + lVar53);
      auVar63._4_4_ = uVar1;
      auVar63._0_4_ = uVar1;
      auVar63._8_4_ = uVar1;
      auVar63._12_4_ = uVar1;
      auVar63._16_4_ = uVar1;
      auVar63._20_4_ = uVar1;
      auVar63._24_4_ = uVar1;
      auVar63._28_4_ = uVar1;
      auVar70 = vfmadd213ps_avx512vl(auVar74,auVar56,auVar63);
      uVar1 = *(undefined4 *)(lVar52 + -0x30 + lVar53);
      auVar75._4_4_ = uVar1;
      auVar75._0_4_ = uVar1;
      auVar75._8_4_ = uVar1;
      auVar75._12_4_ = uVar1;
      auVar75._16_4_ = uVar1;
      auVar75._20_4_ = uVar1;
      auVar75._24_4_ = uVar1;
      auVar75._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x20 + lVar53);
      auVar76._4_4_ = uVar1;
      auVar76._0_4_ = uVar1;
      auVar76._8_4_ = uVar1;
      auVar76._12_4_ = uVar1;
      auVar76._16_4_ = uVar1;
      auVar76._20_4_ = uVar1;
      auVar76._24_4_ = uVar1;
      auVar76._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0x10 + lVar53);
      auVar77._4_4_ = uVar1;
      auVar77._0_4_ = uVar1;
      auVar77._8_4_ = uVar1;
      auVar77._12_4_ = uVar1;
      auVar77._16_4_ = uVar1;
      auVar77._20_4_ = uVar1;
      auVar77._24_4_ = uVar1;
      auVar77._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar52 + -0xc0 + lVar53);
      auVar71._4_4_ = uVar1;
      auVar71._0_4_ = uVar1;
      auVar71._8_4_ = uVar1;
      auVar71._12_4_ = uVar1;
      auVar71._16_4_ = uVar1;
      auVar71._20_4_ = uVar1;
      auVar71._24_4_ = uVar1;
      auVar71._28_4_ = uVar1;
      auVar71 = vfmadd213ps_avx512vl(auVar75,auVar56,auVar71);
      uVar1 = *(undefined4 *)(lVar52 + -0xb0 + lVar53);
      auVar72._4_4_ = uVar1;
      auVar72._0_4_ = uVar1;
      auVar72._8_4_ = uVar1;
      auVar72._12_4_ = uVar1;
      auVar72._16_4_ = uVar1;
      auVar72._20_4_ = uVar1;
      auVar72._24_4_ = uVar1;
      auVar72._28_4_ = uVar1;
      auVar72 = vfmadd213ps_avx512vl(auVar76,auVar56,auVar72);
      uVar1 = *(undefined4 *)(lVar52 + -0xa0 + lVar53);
      auVar73._4_4_ = uVar1;
      auVar73._0_4_ = uVar1;
      auVar73._8_4_ = uVar1;
      auVar73._12_4_ = uVar1;
      auVar73._16_4_ = uVar1;
      auVar73._20_4_ = uVar1;
      auVar73._24_4_ = uVar1;
      auVar73._28_4_ = uVar1;
      auVar73 = vfmadd213ps_avx512vl(auVar77,auVar56,auVar73);
      auVar56 = *(undefined1 (*) [32])ray;
      auVar57 = *(undefined1 (*) [32])(ray + 0x20);
      auVar58 = *(undefined1 (*) [32])(ray + 0x40);
      auVar59 = *(undefined1 (*) [32])(ray + 0x80);
      auVar60 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar61 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar62 = vsubps_avx(auVar65,auVar56);
      auVar63 = vsubps_avx(auVar66,auVar57);
      auVar66 = vsubps_avx512vl(auVar67,auVar58);
      auVar67 = vsubps_avx512vl(auVar68,auVar56);
      auVar68 = vsubps_avx512vl(auVar69,auVar57);
      auVar69 = vsubps_avx512vl(auVar70,auVar58);
      auVar71 = vsubps_avx512vl(auVar71,auVar56);
      auVar72 = vsubps_avx512vl(auVar72,auVar57);
      auVar58 = vsubps_avx512vl(auVar73,auVar58);
      auVar73 = vsubps_avx512vl(auVar71,auVar62);
      auVar70 = vsubps_avx512vl(auVar72,auVar63);
      auVar74 = vsubps_avx512vl(auVar58,auVar66);
      auVar75 = vsubps_avx512vl(auVar62,auVar67);
      in_ZMM14 = ZEXT3264(auVar75);
      auVar76 = vsubps_avx512vl(auVar63,auVar68);
      auVar77 = vsubps_avx512vl(auVar66,auVar69);
      in_ZMM15 = ZEXT3264(auVar77);
      auVar78 = vsubps_avx512vl(auVar67,auVar71);
      auVar79 = vsubps_avx512vl(auVar68,auVar72);
      auVar80 = vsubps_avx512vl(auVar69,auVar58);
      auVar57 = vaddps_avx512vl(auVar71,auVar62);
      auVar65 = vaddps_avx512vl(auVar72,auVar63);
      auVar56 = vaddps_avx512vl(auVar58,auVar66);
      auVar81 = vmulps_avx512vl(auVar65,auVar74);
      auVar81 = vfmsub231ps_avx512vl(auVar81,auVar70,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar73);
      auVar82 = vfmsub231ps_avx512vl(auVar56,auVar74,auVar57);
      auVar56._4_4_ = auVar57._4_4_ * auVar70._4_4_;
      auVar56._0_4_ = auVar57._0_4_ * auVar70._0_4_;
      auVar56._8_4_ = auVar57._8_4_ * auVar70._8_4_;
      auVar56._12_4_ = auVar57._12_4_ * auVar70._12_4_;
      auVar56._16_4_ = auVar57._16_4_ * auVar70._16_4_;
      auVar56._20_4_ = auVar57._20_4_ * auVar70._20_4_;
      auVar56._24_4_ = auVar57._24_4_ * auVar70._24_4_;
      auVar56._28_4_ = auVar57._28_4_;
      auVar87 = vfmsub231ps_fma(auVar56,auVar73,auVar65);
      fVar12 = auVar61._0_4_;
      auVar83._0_4_ = auVar87._0_4_ * fVar12;
      fVar13 = auVar61._4_4_;
      auVar83._4_4_ = auVar87._4_4_ * fVar13;
      fVar14 = auVar61._8_4_;
      auVar83._8_4_ = auVar87._8_4_ * fVar14;
      fVar15 = auVar61._12_4_;
      auVar83._12_4_ = auVar87._12_4_ * fVar15;
      fVar16 = auVar61._16_4_;
      auVar83._16_4_ = fVar16 * 0.0;
      fVar17 = auVar61._20_4_;
      auVar83._20_4_ = fVar17 * 0.0;
      fVar18 = auVar61._24_4_;
      auVar83._24_4_ = fVar18 * 0.0;
      auVar83._28_4_ = 0;
      auVar56 = vfmadd231ps_avx512vl(auVar83,auVar60,auVar82);
      auVar57 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar81);
      auVar56 = vaddps_avx512vl(auVar62,auVar67);
      auVar65 = vaddps_avx512vl(auVar63,auVar68);
      auVar81 = vaddps_avx512vl(auVar66,auVar69);
      auVar82 = vmulps_avx512vl(auVar65,auVar77);
      auVar82 = vfmsub231ps_avx512vl(auVar82,auVar76,auVar81);
      auVar81 = vmulps_avx512vl(auVar81,auVar75);
      auVar81 = vfmsub231ps_avx512vl(auVar81,auVar77,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar76);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar75,auVar65);
      auVar65._4_4_ = auVar56._4_4_ * fVar13;
      auVar65._0_4_ = auVar56._0_4_ * fVar12;
      auVar65._8_4_ = auVar56._8_4_ * fVar14;
      auVar65._12_4_ = auVar56._12_4_ * fVar15;
      auVar65._16_4_ = auVar56._16_4_ * fVar16;
      auVar65._20_4_ = auVar56._20_4_ * fVar17;
      auVar65._24_4_ = auVar56._24_4_ * fVar18;
      auVar65._28_4_ = auVar56._28_4_;
      auVar56 = vfmadd231ps_avx512vl(auVar65,auVar60,auVar81);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar81 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar82);
      in_ZMM13 = ZEXT3264(auVar81);
      auVar56 = vaddps_avx512vl(auVar67,auVar71);
      auVar71 = vaddps_avx512vl(auVar68,auVar72);
      auVar58 = vaddps_avx512vl(auVar69,auVar58);
      auVar72 = vmulps_avx512vl(auVar71,auVar80);
      auVar72 = vfmsub231ps_avx512vl(auVar72,auVar79,auVar58);
      auVar58 = vmulps_avx512vl(auVar58,auVar78);
      auVar58 = vfmsub231ps_avx512vl(auVar58,auVar80,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar79);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar78,auVar71);
      auVar56 = vmulps_avx512vl(auVar56,auVar61);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar60,auVar58);
      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar72);
      auVar58 = vaddps_avx512vl(auVar57,auVar81);
      auVar67 = vaddps_avx512vl(auVar56,auVar58);
      auVar68 = auVar98._0_32_;
      vandps_avx512vl(auVar67,auVar68);
      auVar58 = vmulps_avx512vl(auVar67,auVar103._0_32_);
      auVar71 = vminps_avx512vl(auVar57,auVar81);
      auVar71 = vminps_avx512vl(auVar71,auVar56);
      auVar72 = vxorps_avx512vl(auVar58,auVar65);
      uVar21 = vcmpps_avx512vl(auVar71,auVar72,5);
      auVar71 = vmaxps_avx512vl(auVar57,auVar81);
      auVar56 = vmaxps_avx512vl(auVar71,auVar56);
      uVar22 = vcmpps_avx512vl(auVar56,auVar58,2);
      local_2ae0._0_4_ = uVar49;
      bVar42 = ((byte)uVar21 | (byte)uVar22) & (byte)uVar49;
      auVar58 = auVar99._0_32_;
      if (bVar42 == 0) {
LAB_01d00d6e:
        auVar67 = auVar56;
        bVar42 = 0;
        aVar85 = local_28e0;
        aVar84 = local_28c0;
        auVar79 = local_28a0;
        auVar59 = local_2880;
        auVar60 = local_2860;
        auVar61 = _local_2840;
        auVar57 = _local_2820;
      }
      else {
        auVar56 = vmulps_avx512vl(auVar76,auVar74);
        auVar71 = vmulps_avx512vl(auVar73,auVar77);
        auVar72 = vmulps_avx512vl(auVar75,auVar70);
        auVar69 = vmulps_avx512vl(auVar79,auVar77);
        auVar82 = vmulps_avx512vl(auVar75,auVar80);
        auVar83 = vmulps_avx512vl(auVar78,auVar76);
        auVar70 = vfmsub213ps_avx512vl(auVar70,auVar77,auVar56);
        auVar74 = vfmsub213ps_avx512vl(auVar74,auVar75,auVar71);
        auVar73 = vfmsub213ps_avx512vl(auVar73,auVar76,auVar72);
        auVar76 = vfmsub213ps_avx512vl(auVar80,auVar76,auVar69);
        auVar77 = vfmsub213ps_avx512vl(auVar78,auVar77,auVar82);
        auVar75 = vfmsub213ps_avx512vl(auVar79,auVar75,auVar83);
        vandps_avx512vl(auVar56,auVar68);
        vandps_avx512vl(auVar69,auVar68);
        uVar19 = vcmpps_avx512vl(auVar75,auVar75,1);
        vandps_avx512vl(auVar71,auVar68);
        vandps_avx512vl(auVar82,auVar68);
        uVar55 = vcmpps_avx512vl(auVar75,auVar75,1);
        vandps_avx512vl(auVar72,auVar68);
        in_ZMM14 = ZEXT3264(auVar75);
        vandps_avx512vl(auVar83,auVar68);
        in_ZMM15 = ZEXT3264(auVar75);
        uVar50 = vcmpps_avx512vl(auVar75,auVar75,1);
        bVar43 = (bool)((byte)uVar19 & 1);
        auVar79._0_4_ = (uint)bVar43 * auVar70._0_4_ | (uint)!bVar43 * auVar76._0_4_;
        bVar43 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar79._4_4_ = (uint)bVar43 * auVar70._4_4_ | (uint)!bVar43 * auVar76._4_4_;
        bVar43 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar79._8_4_ = (uint)bVar43 * auVar70._8_4_ | (uint)!bVar43 * auVar76._8_4_;
        bVar43 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar79._12_4_ = (uint)bVar43 * auVar70._12_4_ | (uint)!bVar43 * auVar76._12_4_;
        bVar43 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar79._16_4_ = (uint)bVar43 * auVar70._16_4_ | (uint)!bVar43 * auVar76._16_4_;
        bVar43 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar79._20_4_ = (uint)bVar43 * auVar70._20_4_ | (uint)!bVar43 * auVar76._20_4_;
        bVar43 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar79._24_4_ = (uint)bVar43 * auVar70._24_4_ | (uint)!bVar43 * auVar76._24_4_;
        bVar43 = SUB81(uVar19 >> 7,0);
        auVar79._28_4_ = (uint)bVar43 * auVar70._28_4_ | (uint)!bVar43 * auVar76._28_4_;
        bVar43 = (bool)((byte)uVar55 & 1);
        aVar84._0_4_ = (uint)bVar43 * auVar74._0_4_ | (uint)!bVar43 * auVar77._0_4_;
        bVar43 = (bool)((byte)(uVar55 >> 1) & 1);
        aVar84._4_4_ = (uint)bVar43 * auVar74._4_4_ | (uint)!bVar43 * auVar77._4_4_;
        bVar43 = (bool)((byte)(uVar55 >> 2) & 1);
        aVar84._8_4_ = (uint)bVar43 * auVar74._8_4_ | (uint)!bVar43 * auVar77._8_4_;
        bVar43 = (bool)((byte)(uVar55 >> 3) & 1);
        aVar84._12_4_ = (uint)bVar43 * auVar74._12_4_ | (uint)!bVar43 * auVar77._12_4_;
        bVar43 = (bool)((byte)(uVar55 >> 4) & 1);
        aVar84._16_4_ = (uint)bVar43 * auVar74._16_4_ | (uint)!bVar43 * auVar77._16_4_;
        bVar43 = (bool)((byte)(uVar55 >> 5) & 1);
        aVar84._20_4_ = (uint)bVar43 * auVar74._20_4_ | (uint)!bVar43 * auVar77._20_4_;
        bVar43 = (bool)((byte)(uVar55 >> 6) & 1);
        aVar84._24_4_ = (uint)bVar43 * auVar74._24_4_ | (uint)!bVar43 * auVar77._24_4_;
        bVar43 = SUB81(uVar55 >> 7,0);
        aVar84._28_4_ = (uint)bVar43 * auVar74._28_4_ | (uint)!bVar43 * auVar77._28_4_;
        bVar43 = (bool)((byte)uVar50 & 1);
        aVar85._0_4_ = (float)((uint)bVar43 * auVar73._0_4_ | (uint)!bVar43 * auVar75._0_4_);
        bVar43 = (bool)((byte)(uVar50 >> 1) & 1);
        aVar85._4_4_ = (float)((uint)bVar43 * auVar73._4_4_ | (uint)!bVar43 * auVar75._4_4_);
        bVar43 = (bool)((byte)(uVar50 >> 2) & 1);
        aVar85._8_4_ = (float)((uint)bVar43 * auVar73._8_4_ | (uint)!bVar43 * auVar75._8_4_);
        bVar43 = (bool)((byte)(uVar50 >> 3) & 1);
        aVar85._12_4_ = (float)((uint)bVar43 * auVar73._12_4_ | (uint)!bVar43 * auVar75._12_4_);
        bVar43 = (bool)((byte)(uVar50 >> 4) & 1);
        aVar85._16_4_ = (float)((uint)bVar43 * auVar73._16_4_ | (uint)!bVar43 * auVar75._16_4_);
        bVar43 = (bool)((byte)(uVar50 >> 5) & 1);
        aVar85._20_4_ = (float)((uint)bVar43 * auVar73._20_4_ | (uint)!bVar43 * auVar75._20_4_);
        bVar43 = (bool)((byte)(uVar50 >> 6) & 1);
        aVar85._24_4_ = (float)((uint)bVar43 * auVar73._24_4_ | (uint)!bVar43 * auVar75._24_4_);
        bVar43 = SUB81(uVar50 >> 7,0);
        aVar85._28_4_ = (uint)bVar43 * auVar73._28_4_ | (uint)!bVar43 * auVar75._28_4_;
        auVar78._4_4_ = fVar13 * aVar85._4_4_;
        auVar78._0_4_ = fVar12 * aVar85._0_4_;
        auVar78._8_4_ = fVar14 * aVar85._8_4_;
        auVar78._12_4_ = fVar15 * aVar85._12_4_;
        auVar78._16_4_ = fVar16 * aVar85._16_4_;
        auVar78._20_4_ = fVar17 * aVar85._20_4_;
        auVar78._24_4_ = fVar18 * aVar85._24_4_;
        auVar78._28_4_ = auVar61._28_4_;
        auVar87 = vfmadd213ps_fma(auVar60,(undefined1  [32])aVar84,auVar78);
        auVar87 = vfmadd213ps_fma(auVar59,auVar79,ZEXT1632(auVar87));
        auVar61 = ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                     CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                              CONCAT44(auVar87._4_4_ + auVar87._4_4_,
                                                       auVar87._0_4_ + auVar87._0_4_))));
        auVar80._0_4_ = auVar66._0_4_ * aVar85._0_4_;
        auVar80._4_4_ = auVar66._4_4_ * aVar85._4_4_;
        auVar80._8_4_ = auVar66._8_4_ * aVar85._8_4_;
        auVar80._12_4_ = auVar66._12_4_ * aVar85._12_4_;
        auVar80._16_4_ = auVar66._16_4_ * aVar85._16_4_;
        auVar80._20_4_ = auVar66._20_4_ * aVar85._20_4_;
        auVar80._24_4_ = auVar66._24_4_ * aVar85._24_4_;
        auVar80._28_4_ = 0;
        auVar87 = vfmadd213ps_fma(auVar63,(undefined1  [32])aVar84,auVar80);
        auVar24 = vfmadd213ps_fma(auVar62,auVar79,ZEXT1632(auVar87));
        auVar59 = vrcp14ps_avx512vl(auVar61);
        auVar60 = vxorps_avx512vl(auVar61,auVar65);
        auVar56 = vfnmadd213ps_avx512vl(auVar59,auVar61,auVar58);
        auVar87 = vfmadd132ps_fma(auVar56,auVar59,auVar59);
        auVar59 = ZEXT1632(CONCAT412((auVar24._12_4_ + auVar24._12_4_) * auVar87._12_4_,
                                     CONCAT48((auVar24._8_4_ + auVar24._8_4_) * auVar87._8_4_,
                                              CONCAT44((auVar24._4_4_ + auVar24._4_4_) *
                                                       auVar87._4_4_,
                                                       (auVar24._0_4_ + auVar24._0_4_) *
                                                       auVar87._0_4_))));
        uVar21 = vcmpps_avx512vl(auVar59,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar22 = vcmpps_avx512vl(auVar59,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar23 = vcmpps_avx512vl(auVar61,auVar60,4);
        bVar42 = bVar42 & (byte)uVar21 & (byte)uVar22 & (byte)uVar23;
        auVar60 = auVar67;
        auVar61 = auVar81;
        if (bVar42 == 0) goto LAB_01d00d6e;
      }
      _local_2820 = auVar57;
      _local_2840 = auVar61;
      local_2860 = auVar60;
      local_2880 = auVar59;
      local_28a0 = auVar79;
      local_28c0 = aVar84;
      local_28e0 = aVar85;
      pGVar3 = (context->scene->geometries).items[uVar46].ptr;
      uVar2 = pGVar3->mask;
      auVar82._4_4_ = uVar2;
      auVar82._0_4_ = uVar2;
      auVar82._8_4_ = uVar2;
      auVar82._12_4_ = uVar2;
      auVar82._16_4_ = uVar2;
      auVar82._20_4_ = uVar2;
      auVar82._24_4_ = uVar2;
      auVar82._28_4_ = uVar2;
      uVar21 = vptestmd_avx512vl(auVar82,*(undefined1 (*) [32])(ray + 0x120));
      bVar42 = (byte)uVar21 & bVar42;
      local_2b70 = CONCAT44(local_2b70._4_4_,(uint)bVar42);
      if (bVar42 != 0) {
        local_2b64 = *(undefined4 *)(lVar52 + 0x10 + lVar53);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          vandps_avx512vl(local_2860,auVar68);
          auVar33._8_4_ = 0x219392ef;
          auVar33._0_8_ = 0x219392ef219392ef;
          auVar33._12_4_ = 0x219392ef;
          auVar33._16_4_ = 0x219392ef;
          auVar33._20_4_ = 0x219392ef;
          auVar33._24_4_ = 0x219392ef;
          auVar33._28_4_ = 0x219392ef;
          uVar54 = vcmpps_avx512vl(auVar67,auVar33,5);
          auVar56 = vrcp14ps_avx512vl(local_2860);
          auVar57 = vfnmadd213ps_avx512vl(auVar56,local_2860,auVar58);
          auVar57 = vfmadd132ps_avx512vl(auVar57,auVar56,auVar56);
          fVar12 = (float)((uint)((byte)uVar54 & 1) * auVar57._0_4_);
          fVar18 = (float)((uint)((byte)(uVar54 >> 1) & 1) * auVar57._4_4_);
          fVar17 = (float)((uint)((byte)(uVar54 >> 2) & 1) * auVar57._8_4_);
          fVar16 = (float)((uint)((byte)(uVar54 >> 3) & 1) * auVar57._12_4_);
          fVar15 = (float)((uint)((byte)(uVar54 >> 4) & 1) * auVar57._16_4_);
          fVar14 = (float)((uint)((byte)(uVar54 >> 5) & 1) * auVar57._20_4_);
          fVar13 = (float)((uint)((byte)(uVar54 >> 6) & 1) * auVar57._24_4_);
          auVar37._4_4_ = fVar18 * (float)local_2820._4_4_;
          auVar37._0_4_ = fVar12 * (float)local_2820._0_4_;
          auVar37._8_4_ = fVar17 * fStack_2818;
          auVar37._12_4_ = fVar16 * fStack_2814;
          auVar37._16_4_ = fVar15 * fStack_2810;
          auVar37._20_4_ = fVar14 * fStack_280c;
          auVar37._24_4_ = fVar13 * fStack_2808;
          auVar37._28_4_ = auVar56._28_4_;
          local_2760 = vminps_avx512vl(auVar37,auVar58);
          auVar38._4_4_ = fVar18 * (float)local_2840._4_4_;
          auVar38._0_4_ = fVar12 * (float)local_2840._0_4_;
          auVar38._8_4_ = fVar17 * fStack_2838;
          auVar38._12_4_ = fVar16 * fStack_2834;
          auVar38._16_4_ = fVar15 * fStack_2830;
          auVar38._20_4_ = fVar14 * fStack_282c;
          auVar38._24_4_ = fVar13 * fStack_2828;
          auVar38._28_4_ = (uint)(byte)(uVar54 >> 7) * auVar57._28_4_;
          local_2780 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                       vminps_avx512vl(auVar38,auVar58);
          local_2800._0_8_ = local_28a0._0_8_;
          local_2800._8_8_ = local_28a0._8_8_;
          local_2800._16_8_ = local_28a0._16_8_;
          local_2800._24_8_ = local_28a0._24_8_;
          local_2800.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_28c0;
          local_2800.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_28e0;
          local_27a0 = local_2880._0_8_;
          uStack_2798 = local_2880._8_8_;
          uStack_2790 = local_2880._16_8_;
          uStack_2788 = local_2880._24_8_;
          local_2b50.valid = (int *)&local_2680;
          local_2b50.geometryUserPtr = &local_26e0;
          local_2b50.context = (RTCRayQueryContext *)&local_26c0;
          local_2b50.ray = (RTCRayN *)&local_26a0;
          in_ZMM13 = ZEXT1664(auVar81._0_16_);
          in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
          in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
          local_2b58 = pGVar3;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_2b50,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_2800.field_0);
          local_2740 = vpbroadcastd_avx512vl();
          local_2760 = vpbroadcastd_avx512vl();
          local_2800._0_8_ = local_2680;
          local_2800._8_8_ = uStack_2678;
          local_2800._16_8_ = uStack_2670;
          local_2800._24_8_ = uStack_2668;
          local_2800.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2660;
          local_2800.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2640;
          local_27a0 = local_26a0._0_8_;
          uStack_2798 = local_26a0._8_8_;
          uStack_2790 = local_26a0._16_8_;
          uStack_2788 = local_26a0._24_8_;
          local_2780 = local_26c0;
          vpcmpeqd_avx2(local_2740,local_2740);
          uStack_271c = local_2b78->user->instID[0];
          local_2720 = uStack_271c;
          uStack_2718 = uStack_271c;
          uStack_2714 = uStack_271c;
          uStack_2710 = uStack_271c;
          uStack_270c = uStack_271c;
          uStack_2708 = uStack_271c;
          uStack_2704 = uStack_271c;
          uStack_26fc = local_2b78->user->instPrimID[0];
          local_2700 = uStack_26fc;
          uStack_26f8 = uStack_26fc;
          uStack_26f4 = uStack_26fc;
          uStack_26f0 = uStack_26fc;
          uStack_26ec = uStack_26fc;
          uStack_26e8 = uStack_26fc;
          uStack_26e4 = uStack_26fc;
          local_2b20 = *(undefined1 (*) [32])(ray + 0x100);
          auVar56 = vblendmps_avx512vl(local_2b20,(undefined1  [32])local_26e0);
          bVar43 = (bool)((byte)local_2b70 & 1);
          bVar5 = (bool)((byte)((uint)local_2b70 >> 1) & 1);
          bVar6 = (bool)((byte)((uint)local_2b70 >> 2) & 1);
          bVar7 = (bool)((byte)((uint)local_2b70 >> 3) & 1);
          bVar8 = (bool)((byte)((uint)local_2b70 >> 4) & 1);
          bVar10 = (bool)((byte)((uint)local_2b70 >> 5) & 1);
          bVar9 = (bool)((byte)((uint)local_2b70 >> 6) & 1);
          bVar11 = (bool)((byte)((uint)local_2b70 >> 7) & 1);
          *(uint *)(ray + 0x100) = (uint)bVar43 * auVar56._0_4_ | !bVar43 * uStack_26fc;
          *(uint *)(ray + 0x104) = (uint)bVar5 * auVar56._4_4_ | !bVar5 * uStack_26fc;
          *(uint *)(ray + 0x108) = (uint)bVar6 * auVar56._8_4_ | !bVar6 * uStack_26fc;
          *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar56._12_4_ | !bVar7 * uStack_26fc;
          *(uint *)(ray + 0x110) = (uint)bVar8 * auVar56._16_4_ | !bVar8 * uStack_26fc;
          *(uint *)(ray + 0x114) = (uint)bVar10 * auVar56._20_4_ | !bVar10 * uStack_26fc;
          *(uint *)(ray + 0x118) = (uint)bVar9 * auVar56._24_4_ | !bVar9 * uStack_26fc;
          *(uint *)(ray + 0x11c) = (uint)bVar11 * auVar56._28_4_ | !bVar11 * uStack_26fc;
          local_2ac0 = vpmovm2d_avx512vl(local_2b70 & 0xffffffff);
          local_2b50.valid = (int *)local_2ac0;
          local_2b50.geometryUserPtr = local_2b58->userPtr;
          local_2b50.context = local_2b78->user;
          local_2b50.hit = (RTCHitN *)&local_2800;
          local_2b50.N = 8;
          local_2b50.ray = (RTCRayN *)ray;
          if (local_2b58->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            (*local_2b58->occlusionFilterN)(&local_2b50);
          }
          if (local_2ac0 == (undefined1  [32])0x0) {
            uVar49 = 0;
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar98 = ZEXT3264(auVar56);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar99 = ZEXT3264(auVar56);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar100 = ZEXT3264(auVar56);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar101 = ZEXT3264(auVar56);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar102 = ZEXT3264(auVar56);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar103 = ZEXT3264(auVar56);
          }
          else {
            p_Var4 = local_2b78->args->filter;
            if (p_Var4 == (RTCFilterFunctionN)0x0) {
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar98 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar99 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar100 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar101 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar102 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar103 = ZEXT3264(auVar56);
            }
            else {
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar98 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar99 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar100 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar101 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar102 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar103 = ZEXT3264(auVar56);
              if (((local_2b78->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_2b58->field_8).field_0x2 & 0x40) != 0)
                 ) {
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                (*p_Var4)(&local_2b50);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar103 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar102 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar101 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar100 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar99 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar98 = ZEXT3264(auVar56);
              }
            }
            uVar54 = vptestmd_avx512vl(local_2ac0,local_2ac0);
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar43 = (bool)((byte)uVar54 & 1);
            auVar81._0_4_ =
                 (uint)bVar43 * auVar56._0_4_ | (uint)!bVar43 * *(int *)(local_2b50.ray + 0x100);
            bVar43 = (bool)((byte)(uVar54 >> 1) & 1);
            auVar81._4_4_ =
                 (uint)bVar43 * auVar56._4_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 4);
            bVar43 = (bool)((byte)(uVar54 >> 2) & 1);
            auVar81._8_4_ =
                 (uint)bVar43 * auVar56._8_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 8);
            bVar43 = (bool)((byte)(uVar54 >> 3) & 1);
            auVar81._12_4_ =
                 (uint)bVar43 * auVar56._12_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 0xc);
            bVar43 = (bool)((byte)(uVar54 >> 4) & 1);
            auVar81._16_4_ =
                 (uint)bVar43 * auVar56._16_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 0x10);
            bVar43 = (bool)((byte)(uVar54 >> 5) & 1);
            auVar81._20_4_ =
                 (uint)bVar43 * auVar56._20_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 0x14);
            bVar43 = (bool)((byte)(uVar54 >> 6) & 1);
            auVar81._24_4_ =
                 (uint)bVar43 * auVar56._24_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 0x18);
            bVar43 = SUB81(uVar54 >> 7,0);
            auVar81._28_4_ =
                 (uint)bVar43 * auVar56._28_4_ |
                 (uint)!bVar43 * *(int *)((RayK<8> *)(local_2b50.ray + 0x100) + 0x1c);
            uVar49 = (uint)uVar54;
            *(undefined1 (*) [32])(local_2b50.ray + 0x100) = auVar81;
          }
          bVar42 = (byte)uVar49;
          auVar86._0_4_ =
               (uint)(bVar42 & 1) * *(int *)local_2b60 |
               (uint)!(bool)(bVar42 & 1) * local_2b20._0_4_;
          bVar43 = (bool)((byte)(uVar49 >> 1) & 1);
          auVar86._4_4_ = (uint)bVar43 * *(int *)(local_2b60 + 4) | (uint)!bVar43 * local_2b20._4_4_
          ;
          bVar43 = (bool)((byte)(uVar49 >> 2) & 1);
          auVar86._8_4_ = (uint)bVar43 * *(int *)(local_2b60 + 8) | (uint)!bVar43 * local_2b20._8_4_
          ;
          bVar43 = (bool)((byte)(uVar49 >> 3) & 1);
          auVar86._12_4_ =
               (uint)bVar43 * *(int *)(local_2b60 + 0xc) | (uint)!bVar43 * local_2b20._12_4_;
          bVar43 = (bool)((byte)(uVar49 >> 4) & 1);
          auVar86._16_4_ =
               (uint)bVar43 * *(int *)(local_2b60 + 0x10) | (uint)!bVar43 * local_2b20._16_4_;
          bVar43 = (bool)((byte)(uVar49 >> 5) & 1);
          auVar86._20_4_ =
               (uint)bVar43 * *(int *)(local_2b60 + 0x14) | (uint)!bVar43 * local_2b20._20_4_;
          bVar43 = (bool)((byte)(uVar49 >> 6) & 1);
          auVar86._24_4_ =
               (uint)bVar43 * *(int *)(local_2b60 + 0x18) | (uint)!bVar43 * local_2b20._24_4_;
          bVar43 = (bool)((byte)(uVar49 >> 7) & 1);
          auVar86._28_4_ =
               (uint)bVar43 * *(int *)(local_2b60 + 0x1c) | (uint)!bVar43 * local_2b20._28_4_;
          *(undefined1 (*) [32])local_2b60 = auVar86;
          uVar54 = local_2b80;
          context = local_2b78;
          uVar49 = local_2ae0._0_4_;
        }
        uVar49 = CONCAT31((int3)(uVar49 >> 8),(byte)uVar49 & ~bVar42);
      }
      lVar53 = lVar53 + 4;
      lVar47 = local_2ae8;
    } while ((char)uVar49 != '\0');
    uVar49 = 0;
LAB_01d011c8:
    lVar47 = local_2ae8 + 1;
    lVar52 = lVar52 + 0x140;
    bVar44 = bVar44 & (byte)uVar49;
  } while (bVar44 != 0);
  bVar44 = 0;
LAB_01d011e5:
  bVar44 = (byte)local_2b8c | ~bVar44;
  local_2b8c = (uint)bVar44;
  if (bVar44 == 0xff) {
    bVar44 = 0xff;
    goto LAB_01d01344;
  }
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_2900._0_4_ =
       (uint)(bVar44 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar44 & 1) * local_2900._0_4_;
  bVar43 = (bool)(bVar44 >> 1 & 1);
  local_2900._4_4_ = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * local_2900._4_4_;
  bVar43 = (bool)(bVar44 >> 2 & 1);
  local_2900._8_4_ = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * local_2900._8_4_;
  bVar43 = (bool)(bVar44 >> 3 & 1);
  local_2900._12_4_ = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * local_2900._12_4_;
  bVar43 = (bool)(bVar44 >> 4 & 1);
  local_2900._16_4_ = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * local_2900._16_4_;
  bVar43 = (bool)(bVar44 >> 5 & 1);
  local_2900._20_4_ = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * local_2900._20_4_;
  bVar43 = (bool)(bVar44 >> 6 & 1);
  local_2900._24_4_ = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * local_2900._24_4_;
  local_2900._28_4_ =
       (uint)(bVar44 >> 7) * auVar56._28_4_ | (uint)!(bool)(bVar44 >> 7) * local_2900._28_4_;
  goto LAB_01d00677;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }